

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabFilterMethod
              (sqlite3_vtab_cursor *pCursor,int idxNum,char *zUnused,int nUnused,
              sqlite3_value **apVal)

{
  int iVar1;
  int iVar2;
  sqlite3_vtab *psVar3;
  sqlite3_vtab *psVar4;
  int in_ECX;
  char *in_RDX;
  uint in_ESI;
  sqlite3_vtab_cursor *in_RDI;
  Fts5Colset *in_R8;
  bool bVar5;
  Fts5Index *pIndex;
  char *zCopy;
  sqlite3_value *pLe;
  sqlite3_value *pGe;
  sqlite3_value *pEq;
  int nTerm;
  char *zTerm;
  int f;
  int iVal;
  int rc;
  int eType;
  Fts5VocabCursor *pCsr;
  Fts5VocabTable *pTab;
  int in_stack_ffffffffffffff7c;
  uchar *local_78;
  Fts5Colset pCsr_00;
  Fts5Colset local_68;
  Fts5Colset local_60;
  uint local_44;
  int local_40;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  psVar4 = in_RDI->pVtab;
  iVar1 = psVar4[2].nRef;
  local_40 = 0;
  local_60.nCol = 0;
  local_60.aiCol[0] = 0;
  local_68.nCol = 0;
  local_68.aiCol[0] = 0;
  pCsr_00.nCol = 0;
  pCsr_00.aiCol[0] = 0;
  fts5VocabResetCursor((Fts5VocabCursor *)0x29465c);
  bVar5 = (in_ESI & 0x100) != 0;
  if (bVar5) {
    local_60 = *in_R8;
  }
  local_44 = (uint)bVar5;
  if ((in_ESI & 0x200) != 0) {
    local_68 = in_R8[(int)local_44];
    local_44 = local_44 + 1;
  }
  if ((in_ESI & 0x400) != 0) {
    pCsr_00 = in_R8[(int)local_44];
  }
  *(uint *)&in_RDI[8].pVtab = in_ESI & 0xff;
  if (local_60 == (Fts5Colset)0x0) {
    if (local_68 != (Fts5Colset)0x0) {
      sqlite3_value_text((sqlite3_value *)0x294736);
      sqlite3_value_bytes((sqlite3_value *)0x294745);
    }
    if (pCsr_00 != (Fts5Colset)0x0) {
      local_78 = sqlite3_value_text((sqlite3_value *)0x29475f);
      if (local_78 == (uchar *)0x0) {
        local_78 = "";
      }
      iVar2 = sqlite3_value_bytes((sqlite3_value *)0x294782);
      *(int *)&in_RDI[6].pVtab = iVar2;
      psVar3 = (sqlite3_vtab *)sqlite3_malloc(in_stack_ffffffffffffff7c);
      in_RDI[7].pVtab = psVar3;
      if (in_RDI[7].pVtab == (sqlite3_vtab *)0x0) {
        local_40 = 7;
      }
      else {
        memcpy(in_RDI[7].pVtab,local_78,(long)(*(int *)&in_RDI[6].pVtab + 1));
      }
    }
  }
  else {
    sqlite3_value_text((sqlite3_value *)0x294704);
    sqlite3_value_bytes((sqlite3_value *)0x294713);
  }
  if ((local_40 == 0) &&
     (local_40 = sqlite3Fts5IndexQuery
                           ((Fts5Index *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,in_ECX,
                            in_stack_ffffffffffffffe0,in_R8,(Fts5IndexIter **)psVar4), local_40 == 0
     )) {
    psVar4 = (sqlite3_vtab *)sqlite3Fts5StructureRef((Fts5Index *)0x294836);
    in_RDI[5].pVtab = psVar4;
  }
  if ((local_40 == 0) && (iVar1 == 2)) {
    local_40 = fts5VocabInstanceNewTerm((Fts5VocabCursor *)pCsr_00);
  }
  if (((local_40 == 0) && (*(int *)&in_RDI[3].pVtab == 0)) &&
     ((iVar1 != 2 || (*(int *)((long)&(in_RDI[2].pVtab[1].pModule)->xBegin + 4) != 1)))) {
    local_40 = fts5VocabNextMethod(in_RDI);
  }
  return local_40;
}

Assistant:

static int fts5VocabFilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *zUnused,            /* Unused */
  int nUnused,                    /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  int eType = pTab->eType;
  int rc = SQLITE_OK;

  int iVal = 0;
  int f = FTS5INDEX_QUERY_SCAN;
  const char *zTerm = 0;
  int nTerm = 0;

  sqlite3_value *pEq = 0;
  sqlite3_value *pGe = 0;
  sqlite3_value *pLe = 0;

  UNUSED_PARAM2(zUnused, nUnused);

  fts5VocabResetCursor(pCsr);
  if( idxNum & FTS5_VOCAB_TERM_EQ ) pEq = apVal[iVal++];
  if( idxNum & FTS5_VOCAB_TERM_GE ) pGe = apVal[iVal++];
  if( idxNum & FTS5_VOCAB_TERM_LE ) pLe = apVal[iVal++];
  pCsr->colUsed = (idxNum & FTS5_VOCAB_COLUSED_MASK);

  if( pEq ){
    zTerm = (const char *)sqlite3_value_text(pEq);
    nTerm = sqlite3_value_bytes(pEq);
    f = FTS5INDEX_QUERY_NOTOKENDATA;
  }else{
    if( pGe ){
      zTerm = (const char *)sqlite3_value_text(pGe);
      nTerm = sqlite3_value_bytes(pGe);
    }
    if( pLe ){
      const char *zCopy = (const char *)sqlite3_value_text(pLe);
      if( zCopy==0 ) zCopy = "";
      pCsr->nLeTerm = sqlite3_value_bytes(pLe);
      pCsr->zLeTerm = sqlite3_malloc(pCsr->nLeTerm+1);
      if( pCsr->zLeTerm==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memcpy(pCsr->zLeTerm, zCopy, pCsr->nLeTerm+1);
      }
    }
  }

  if( rc==SQLITE_OK ){
    Fts5Index *pIndex = pCsr->pFts5->pIndex;
    rc = sqlite3Fts5IndexQuery(pIndex, zTerm, nTerm, f, 0, &pCsr->pIter);
    if( rc==SQLITE_OK ){
      pCsr->pStruct = sqlite3Fts5StructureRef(pIndex);
    }
  }
  if( rc==SQLITE_OK && eType==FTS5_VOCAB_INSTANCE ){
    rc = fts5VocabInstanceNewTerm(pCsr);
  }
  if( rc==SQLITE_OK && !pCsr->bEof
   && (eType!=FTS5_VOCAB_INSTANCE
    || pCsr->pFts5->pConfig->eDetail!=FTS5_DETAIL_NONE)
  ){
    rc = fts5VocabNextMethod(pCursor);
  }

  return rc;
}